

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::InnerProduct3D_1D_1D::forward_impl
          (InnerProduct3D_1D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  size_type sVar1;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar2;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> d;
  array<DimPair,_1> dims2;
  array<DimPair,_1> dims;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> c;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> b;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffd28;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffd30;
  Tensor *in_stack_fffffffffffffd40;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffd48;
  Tensor *in_stack_fffffffffffffd50;
  TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
  *in_stack_fffffffffffffd58;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_88;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_78;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_40 = in_RSI;
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::t<3>(in_stack_fffffffffffffd50);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_40,1);
  local_78 = Tensor::t<1>(in_stack_fffffffffffffd40);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_40,2);
  local_88 = Tensor::t<1>(in_stack_fffffffffffffd40);
  local_20 = &local_98;
  local_28 = 2;
  local_30 = 0;
  local_98 = 2;
  local_90 = 0;
  local_8 = &local_a8;
  local_10 = 1;
  local_18 = 0;
  local_a8 = 1;
  local_a0 = 0;
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(local_40);
  if (sVar1 == 3) {
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (array<Eigen::IndexPair<long>,_1UL> *)in_stack_fffffffffffffd40);
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
                *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (array<Eigen::IndexPair<long>,_1UL> *)in_stack_fffffffffffffd40);
    Tensor::t<1>(in_stack_fffffffffffffd40);
    Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>::operator=
              (in_stack_fffffffffffffd30,&in_stack_fffffffffffffd28->m_lhs_xpr);
  }
  else {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_40,3);
    Tensor::t<1>(in_stack_fffffffffffffd40);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (array<Eigen::IndexPair<long>,_1UL> *)in_stack_fffffffffffffd40);
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
                *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (array<Eigen::IndexPair<long>,_1UL> *)in_stack_fffffffffffffd40);
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::operator+(in_stack_fffffffffffffd58,
                (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)
                in_stack_fffffffffffffd50);
    TVar2 = Tensor::t<1>(in_stack_fffffffffffffd40);
    Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>::operator=
              ((TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)TVar2.m_data,
               in_stack_fffffffffffffd28);
  }
  return;
}

Assistant:

void InnerProduct3D_1D_1D::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  auto A = xs[0]->t<3>();
  auto b = xs[1]->t<1>();
  auto c = xs[2]->t<1>();
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  Eigen::array<DimPair, 1> dims({{DimPair(2, 0)}});
  Eigen::array<DimPair, 1> dims2({{DimPair(1, 0)}});
  if (xs.size() == 3) {
    fx.t<1>() = A.contract(b, dims).contract(c, dims2);
  } else {
    auto d = xs[3]->t<1>();
    fx.t<1>() = A.contract(b, dims).contract(c, dims2) + d;
  }
}